

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  uchar filterType;
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong bytewidth;
  uchar *puVar4;
  void *pvVar5;
  uchar *puVar6;
  long lVar7;
  ulong uVar8;
  LodePNGFilterStrategy LVar9;
  ulong uVar10;
  ulong length;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uchar *puVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float result;
  undefined1 auVar24 [64];
  float fVar25;
  undefined1 auVar26 [64];
  undefined1 in_XMM18 [16];
  uchar *local_4f0;
  uchar *local_4e8;
  uchar *local_4b8;
  uchar *dummy;
  size_t size [5];
  uchar *attempt [5];
  uint count [256];
  
  uVar13 = (ulong)h;
  uVar3 = lodepng_get_bpp(info);
  LVar9 = settings->filter_strategy;
  if ((settings->filter_palette_zero != 0) &&
     ((info->colortype == LCT_PALETTE || (info->bitdepth < 8)))) {
    LVar9 = LFS_ZERO;
  }
  if (uVar3 == 0) {
    uVar3 = 0x1f;
  }
  else if (LVar9 < (LFS_PREDEFINED|LFS_MINSUM)) {
    bytewidth = (ulong)(uVar3 + 7 >> 3);
    length = (ulong)(w * uVar3 + 7 >> 3);
    switch(LVar9) {
    case LFS_ZERO:
      uVar13 = (ulong)h;
      uVar3 = 0;
      puVar15 = out + 1;
      puVar6 = (uchar *)0x0;
      while (puVar4 = in, bVar19 = uVar13 != 0, uVar13 = uVar13 - 1, bVar19) {
        puVar15[-1] = '\0';
        filterScanline(puVar15,puVar4,puVar6,length,bytewidth,'\0');
        puVar15 = puVar15 + length + 1;
        in = puVar4 + length;
        puVar6 = puVar4;
      }
      break;
    case LFS_MINSUM:
      lVar16 = 0;
      do {
        if (lVar16 == 5) {
          uVar12 = 0;
          local_4b8 = (uchar *)0x0;
          puVar6 = out + 1;
          uVar11 = 0;
          for (uVar18 = 0; uVar18 != uVar13; uVar18 = uVar18 + 1) {
            lVar16 = uVar18 * length;
            for (uVar14 = 0; uVar14 != 5; uVar14 = uVar14 + 1) {
              puVar15 = *(uchar **)(count + uVar14 * 2);
              filterScanline(puVar15,in + lVar16,local_4b8,length,bytewidth,(uchar)uVar14);
              uVar8 = 0;
              uVar10 = 0;
              if (uVar14 == 0) {
                for (; length != uVar10; uVar10 = uVar10 + 1) {
                  uVar8 = uVar8 + puVar15[uVar10];
                }
              }
              else {
                for (; length != uVar10; uVar10 = uVar10 + 1) {
                  bVar1 = puVar15[uVar10];
                  uVar3 = bVar1 ^ 0xff;
                  if (-1 < (char)bVar1) {
                    uVar3 = (uint)bVar1;
                  }
                  uVar8 = uVar8 + uVar3;
                }
              }
              if (uVar8 < uVar12 || uVar14 == 0) {
                uVar12 = uVar8;
                uVar11 = uVar14 & 0xff;
              }
            }
            out[(length + 1) * uVar18] = (uchar)uVar11;
            for (uVar14 = 0; length != uVar14; uVar14 = uVar14 + 1) {
              puVar6[uVar14] = *(uchar *)(*(long *)(count + uVar11 * 2) + uVar14);
            }
            puVar6 = puVar6 + length + 1;
            local_4b8 = in + lVar16;
          }
          for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
            free(*(void **)(count + lVar16 * 2));
          }
          goto LAB_004c17eb;
        }
        pvVar5 = malloc(length);
        *(void **)(count + lVar16 * 2) = pvVar5;
        lVar16 = lVar16 + 1;
      } while (pvVar5 != (void *)0x0);
LAB_004c1316:
      uVar3 = 0x53;
      break;
    case LFS_ENTROPY:
      lVar16 = 0;
LAB_004c126d:
      if (lVar16 != 5) goto code_r0x004c1277;
      lVar16 = length + 1;
      auVar26 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar12 = 0;
      puVar6 = out + 1;
      puVar15 = (uchar *)0x0;
      for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
        lVar17 = uVar11 * length;
        for (uVar18 = 0; uVar18 != 5; uVar18 = uVar18 + 1) {
          puVar4 = (uchar *)size[uVar18];
          filterScanline(puVar4,in + lVar17,puVar15,length,bytewidth,(uchar)uVar18);
          for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
            count[lVar7] = 0;
          }
          for (uVar14 = 0; length != uVar14; uVar14 = uVar14 + 1) {
            count[puVar4[uVar14]] = count[puVar4[uVar14]] + 1;
          }
          count[uVar18] = count[uVar18] + 1;
          fVar22 = 0.0;
          for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
            if (count[lVar7] == 0) {
              fVar23 = 0.0;
            }
            else {
              auVar21 = vcvtusi2ss_avx512f(in_XMM18,count[lVar7]);
              auVar24 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar23 = auVar21._0_4_ / (float)lVar16;
              for (fVar25 = 1.0 / fVar23; 32.0 < fVar25; fVar25 = fVar25 * 0.0625) {
                auVar24 = ZEXT464((uint)(auVar24._0_4_ + 4.0));
              }
              for (; 2.0 < fVar25; fVar25 = fVar25 * 0.5) {
                auVar24 = ZEXT464((uint)(auVar24._0_4_ + 1.0));
              }
              auVar21 = vfmadd231ss_fma(ZEXT416((uint)((fVar25 * fVar25 * fVar25) / 3.0 +
                                                      fVar25 * fVar25 * 3.0 * -0.5)),
                                        SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar25));
              auVar21 = vaddss_avx512f(auVar21,ZEXT416(0xbfeaaa8f));
              auVar21 = vfmadd231ss_avx512f(auVar24._0_16_,auVar21,ZEXT416(0x3fb8aa3b));
              fVar23 = fVar23 * auVar21._0_4_;
            }
            fVar22 = fVar23 + fVar22;
          }
          bVar20 = uVar18 == 0;
          bVar19 = fVar22 < auVar26._0_4_;
          if (bVar19 || bVar20) {
            uVar12 = uVar18 & 0xffffffff;
          }
          auVar26 = ZEXT1664(CONCAT124(auVar26._4_12_,
                                       (uint)(bVar19 || bVar20) * (int)fVar22 +
                                       (uint)(!bVar19 && !bVar20) * (int)auVar26._0_4_));
        }
        out[lVar16 * uVar11] = (uchar)uVar12;
        for (uVar18 = 0; length != uVar18; uVar18 = uVar18 + 1) {
          puVar6[uVar18] = *(uchar *)(size[uVar12] + uVar18);
        }
        puVar6 = puVar6 + lVar16;
        puVar15 = in + lVar17;
      }
      for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
        free((void *)size[lVar16]);
      }
      goto LAB_004c17eb;
    case LFS_BRUTE_FORCE:
      uVar2 = (settings->zlibsettings).use_lz77;
      lVar16 = 0;
      count[2] = (settings->zlibsettings).windowsize;
      count[3] = (settings->zlibsettings).minmatch;
      auVar21 = ZEXT816(0) << 0x20;
      count[4] = (settings->zlibsettings).nicematch;
      count[5] = (settings->zlibsettings).lazymatching;
      count._40_8_ = (settings->zlibsettings).custom_context;
      count[1] = uVar2;
      count[0] = 1;
      count[6] = auVar21._0_4_;
      count[7] = auVar21._4_4_;
      count[8] = auVar21._8_4_;
      count[9] = auVar21._12_4_;
LAB_004c12ca:
      if (lVar16 != 5) goto code_r0x004c12d4;
      local_4e8 = (uchar *)0x0;
      uVar11 = 0;
      uVar18 = 0;
      puVar6 = out + 1;
      for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
        lVar16 = uVar12 * length;
        lVar17 = 0;
        for (uVar14 = 0; uVar14 != 5; uVar14 = uVar14 + 1) {
          puVar15 = attempt[uVar14];
          filterScanline(puVar15,in + lVar16,local_4e8,length,bytewidth,(uchar)uVar14);
          size[uVar14] = 0;
          dummy = (uchar *)0x0;
          zlib_compress(&dummy,(size_t *)((long)size + lVar17),puVar15,length,
                        (LodePNGCompressSettings *)count);
          free(dummy);
          if (size[uVar14] < uVar11 || lVar17 == 0) {
            uVar18 = uVar14 & 0xffffffff;
            uVar11 = size[uVar14];
          }
          lVar17 = lVar17 + 8;
        }
        out[(length + 1) * uVar12] = (uchar)uVar18;
        for (uVar14 = 0; length != uVar14; uVar14 = uVar14 + 1) {
          puVar6[uVar14] = attempt[uVar18][uVar14];
        }
        puVar6 = puVar6 + length + 1;
        local_4e8 = in + lVar16;
      }
      for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
        free(attempt[lVar16]);
      }
      goto LAB_004c17eb;
    case LFS_PREDEFINED:
      local_4f0 = out + 1;
      puVar6 = (uchar *)0x0;
      for (uVar11 = 0; puVar15 = in, uVar13 != uVar11; uVar11 = uVar11 + 1) {
        filterType = settings->predefined_filters[uVar11];
        local_4f0[-1] = filterType;
        filterScanline(local_4f0,puVar15,puVar6,length,bytewidth,filterType);
        local_4f0 = local_4f0 + length + 1;
        in = puVar15 + length;
        puVar6 = puVar15;
      }
LAB_004c17eb:
      uVar3 = 0;
    }
  }
  else {
    uVar3 = 0x58;
  }
  return uVar3;
code_r0x004c12d4:
  puVar6 = (uchar *)malloc(length);
  attempt[lVar16] = puVar6;
  lVar16 = lVar16 + 1;
  if (puVar6 == (uchar *)0x0) goto LAB_004c1316;
  goto LAB_004c12ca;
code_r0x004c1277:
  pvVar5 = malloc(length);
  size[lVar16] = (size_t)pvVar5;
  lVar16 = lVar16 + 1;
  if (pvVar5 == (void *)0x0) goto LAB_004c1316;
  goto LAB_004c126d;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = linebytes;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}